

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

void __thiscall
World::World(World *this,
            array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_6UL>
            *dbinfo,Config *eoserv_config,Config *admin_config)

{
  Timer *this_00;
  Config *this_01;
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pEVar3;
  pointer puVar4;
  __uniq_ptr_impl<NPC_Data,_std::default_delete<NPC_Data>_> this_02;
  pointer pcVar5;
  double dVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  bool bVar9;
  short sVar10;
  short sVar11;
  int iVar12;
  int iVar13;
  const_iterator cVar14;
  long *plVar15;
  mapped_type *pmVar16;
  EIF *this_03;
  ENF *this_04;
  ESF *this_05;
  ECF *this_06;
  NPC_Data *this_07;
  Map *this_08;
  TimeEvent *pTVar17;
  Board *pBVar18;
  GuildManager *pGVar19;
  long *plVar20;
  size_type *psVar21;
  uint uVar22;
  size_t i;
  size_type __new_size;
  Engine type;
  long lVar23;
  char *__end;
  long lVar24;
  pointer pEVar25;
  ENF_Data_Base<ENF> npc;
  shared_ptr<Quest> q;
  string dbdesc;
  undefined1 local_150 [8];
  element_type *local_148;
  undefined1 auStack_140 [24];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  key_type local_108;
  key_type local_e8;
  vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  *local_c8;
  vector<Map_*,_std::allocator<Map_*>_> *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  Config *local_90;
  Config *local_88;
  Config *local_80;
  Config *local_78;
  Config *local_70;
  Config *local_68;
  Database *local_60;
  _Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest>>>>
  *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  this_00 = &this->timer;
  Timer::Timer(this_00);
  local_60 = &this->db;
  Database::Database(local_60);
  local_c8 = &this->npc_data;
  (this->npc_data).
  super__Vector_base<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->npc_data).
  super__Vector_base<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->npc_data).
  super__Vector_base<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = &this->config;
  (this->config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_buckets =
       &(this->config).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
        ._M_h._M_single_bucket;
  (this->config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_bucket_count = 1;
  (this->config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_element_count = 0;
  (this->config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->config).filename._M_dataplus._M_p = (pointer)&(this->config).filename.field_2;
  (this->config).filename._M_string_length = 0;
  (this->config).filename.field_2._M_local_buf[0] = '\0';
  (this->admin_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_buckets =
       &(this->admin_config).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
        ._M_h._M_single_bucket;
  (this->admin_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_bucket_count = 1;
  (this->admin_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->admin_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_element_count = 0;
  (this->admin_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->admin_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->admin_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->admin_config).filename._M_dataplus._M_p = (pointer)&(this->admin_config).filename.field_2;
  (this->admin_config).filename._M_string_length = 0;
  (this->admin_config).filename.field_2._M_local_buf[0] = '\0';
  local_68 = &this->drops_config;
  (this->drops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_buckets =
       &(this->drops_config).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
        ._M_h._M_single_bucket;
  (this->drops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_bucket_count = 1;
  (this->drops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->drops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_element_count = 0;
  (this->drops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->drops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->drops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->drops_config).filename._M_dataplus._M_p = (pointer)&(this->drops_config).filename.field_2;
  (this->drops_config).filename._M_string_length = 0;
  (this->drops_config).filename.field_2._M_local_buf[0] = '\0';
  local_70 = &this->shops_config;
  (this->shops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_buckets =
       &(this->shops_config).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
        ._M_h._M_single_bucket;
  (this->shops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_bucket_count = 1;
  (this->shops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->shops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_element_count = 0;
  (this->shops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->shops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->shops_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->shops_config).filename._M_dataplus._M_p = (pointer)&(this->shops_config).filename.field_2;
  (this->shops_config).filename._M_string_length = 0;
  (this->shops_config).filename.field_2._M_local_buf[0] = '\0';
  local_78 = &this->arenas_config;
  (this->arenas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_buckets =
       &(this->arenas_config).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
        ._M_h._M_single_bucket;
  (this->arenas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_bucket_count = 1;
  (this->arenas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->arenas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_element_count = 0;
  (this->arenas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->arenas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->arenas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->arenas_config).filename._M_dataplus._M_p = (pointer)&(this->arenas_config).filename.field_2
  ;
  (this->arenas_config).filename._M_string_length = 0;
  (this->arenas_config).filename.field_2._M_local_buf[0] = '\0';
  local_80 = &this->formulas_config;
  (this->formulas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_buckets =
       &(this->formulas_config).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
        ._M_h._M_single_bucket;
  (this->formulas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_bucket_count = 1;
  (this->formulas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->formulas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_element_count = 0;
  (this->formulas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->formulas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->formulas_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->formulas_config).filename._M_dataplus._M_p =
       (pointer)&(this->formulas_config).filename.field_2;
  (this->formulas_config).filename._M_string_length = 0;
  (this->formulas_config).filename.field_2._M_local_buf[0] = '\0';
  local_88 = &this->home_config;
  (this->home_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_buckets =
       &(this->home_config).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
        ._M_h._M_single_bucket;
  (this->home_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_bucket_count = 1;
  (this->home_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->home_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_element_count = 0;
  (this->home_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->home_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->home_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->home_config).filename._M_dataplus._M_p = (pointer)&(this->home_config).filename.field_2;
  (this->home_config).filename._M_string_length = 0;
  (this->home_config).filename.field_2._M_local_buf[0] = '\0';
  local_90 = &this->skills_config;
  (this->skills_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_buckets =
       &(this->skills_config).
        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
        ._M_h._M_single_bucket;
  (this->skills_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_bucket_count = 1;
  (this->skills_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->skills_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_element_count = 0;
  (this->skills_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->skills_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_rehash_policy._M_next_resize = 0;
  (this->skills_config).
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->skills_config).filename._M_dataplus._M_p = (pointer)&(this->skills_config).filename.field_2
  ;
  (this->skills_config).filename._M_string_length = 0;
  (this->skills_config).filename.field_2._M_local_buf[0] = '\0';
  (this->formulas_cache)._M_h._M_buckets = &(this->formulas_cache)._M_h._M_single_bucket;
  (this->formulas_cache)._M_h._M_bucket_count = 1;
  (this->formulas_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->formulas_cache)._M_h._M_element_count = 0;
  (this->formulas_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->formulas_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->formulas_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"ServerLanguage","");
  cVar14 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)eoserv_config,&local_e8);
  util::variant::GetString_abi_cxx11_
            ((string *)local_150,
             (variant *)
             ((long)cVar14.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                    ._M_cur + 0x28));
  I18N::I18N(&this->i18n,(string *)local_150);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,auStack_140._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  local_c0 = &this->maps;
  p_Var1 = &(this->quests)._M_t._M_impl.super__Rb_tree_header;
  (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parties).super__Vector_base<Party_*,_std::allocator<Party_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parties).super__Vector_base<Party_*,_std::allocator<Party_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parties).super__Vector_base<Party_*,_std::allocator<Party_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->homes).super__Vector_base<Home_*,_std::allocator<Home_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->quests)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->quests)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->instrument_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->instrument_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->instrument_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->instrument_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_58 = (_Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest>>>>
              *)&this->quests;
  if ((int)((this->timer).resolution * 1000.0) < 2) {
    Console::Out("Timers set at < 1 ms resolution");
  }
  else {
    Console::Out("Timers set at approx. %i ms resolution");
  }
  if (this_01 != eoserv_config) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_01,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)eoserv_config);
  }
  std::__cxx11::string::_M_assign((string *)&(this->config).filename);
  if (&this->admin_config != admin_config) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,util::variant>,std::allocator<std::pair<std::__cxx11::string_const,util::variant>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->admin_config,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)admin_config);
  }
  std::__cxx11::string::_M_assign((string *)&(this->admin_config).filename);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  util::lowercase((string *)local_150,dbinfo->_M_elems);
  iVar12 = std::__cxx11::string::compare(local_150);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,auStack_140._0_8_ + 1);
  }
  if (iVar12 == 0) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"SQLite: ","");
    plVar15 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_108,(ulong)dbinfo->_M_elems[1]._M_dataplus._M_p);
    plVar20 = plVar15 + 2;
    if ((long *)*plVar15 == plVar20) {
      auStack_140._0_8_ = *plVar20;
      auStack_140._8_8_ = plVar15[3];
      local_150 = (undefined1  [8])auStack_140;
    }
    else {
      auStack_140._0_8_ = *plVar20;
      local_150 = (undefined1  [8])*plVar15;
    }
    local_148 = (element_type *)plVar15[1];
    *plVar15 = (long)plVar20;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_e8,(string *)local_150);
    if (local_150 != (undefined1  [8])auStack_140) {
      operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    type = SQLite;
  }
  else {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"MySQL: ","");
    plVar15 = (long *)std::__cxx11::string::_M_append
                                ((char *)local_50,(ulong)dbinfo->_M_elems[2]._M_dataplus._M_p);
    plVar20 = plVar15 + 2;
    if ((long *)*plVar15 == plVar20) {
      local_a8 = *plVar20;
      lStack_a0 = plVar15[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *plVar20;
      local_b8 = (long *)*plVar15;
    }
    local_b0 = plVar15[1];
    *plVar15 = (long)plVar20;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_b8);
    psVar21 = (size_type *)(plVar15 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_108.field_2._M_allocated_capacity = *psVar21;
      local_108.field_2._8_8_ = plVar15[3];
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar21;
      local_108._M_dataplus._M_p = (pointer)*plVar15;
    }
    local_108._M_string_length = plVar15[1];
    *plVar15 = (long)psVar21;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_108,(ulong)dbinfo->_M_elems[1]._M_dataplus._M_p);
    plVar20 = plVar15 + 2;
    if ((long *)*plVar15 == plVar20) {
      auStack_140._0_8_ = *plVar20;
      auStack_140._8_8_ = plVar15[3];
      local_150 = (undefined1  [8])auStack_140;
    }
    else {
      auStack_140._0_8_ = *plVar20;
      local_150 = (undefined1  [8])*plVar15;
    }
    local_148 = (element_type *)plVar15[1];
    *plVar15 = (long)plVar20;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_e8,(string *)local_150);
    if (local_150 != (undefined1  [8])auStack_140) {
      operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    __rhs = dbinfo->_M_elems + 5;
    iVar12 = std::__cxx11::string::compare((char *)__rhs);
    if ((iVar12 != 0) && (iVar12 = std::__cxx11::string::compare((char *)__rhs), iVar12 != 0)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                     ":",__rhs);
      std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_150);
      if (local_150 != (undefined1  [8])auStack_140) {
        operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
      }
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   "/",dbinfo->_M_elems + 4);
    std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_150);
    if (local_150 != (undefined1  [8])auStack_140) {
      operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
    }
    type = MySQL;
  }
  Console::Out("Connecting to database (%s)...",local_e8._M_dataplus._M_p);
  iVar12 = util::to_int(dbinfo->_M_elems + 5);
  Database::Connect(local_60,type,dbinfo->_M_elems + 1,(unsigned_short)iVar12,dbinfo->_M_elems + 2,
                    dbinfo->_M_elems + 3,dbinfo->_M_elems + 4);
  BeginDB(this);
  paVar2 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"DropsFile","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_108);
  util::variant::GetString_abi_cxx11_((string *)local_150,pmVar16);
  Config::Read(local_68,(string *)local_150,false);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ShopsFile","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_108);
  util::variant::GetString_abi_cxx11_((string *)local_150,pmVar16);
  Config::Read(local_70,(string *)local_150,false);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ArenasFile","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_108);
  util::variant::GetString_abi_cxx11_((string *)local_150,pmVar16);
  Config::Read(local_78,(string *)local_150,false);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"FormulasFile","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_108);
  util::variant::GetString_abi_cxx11_((string *)local_150,pmVar16);
  Config::Read(local_80,(string *)local_150,false);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"HomeFile","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_108);
  util::variant::GetString_abi_cxx11_((string *)local_150,pmVar16);
  Config::Read(local_88,(string *)local_150,false);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"SkillsFile","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_108);
  util::variant::GetString_abi_cxx11_((string *)local_150,pmVar16);
  Config::Read(local_90,(string *)local_150,false);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  UpdateConfig(this);
  LoadHome(this);
  local_150 = (undefined1  [8])auStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"AutoSplitPubFiles","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_150);
  bVar9 = util::variant::GetBool(pmVar16);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  this_03 = (EIF *)operator_new(0x38);
  local_108._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"EIF","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_108);
  util::variant::GetString_abi_cxx11_((string *)local_150,pmVar16);
  EIF::EIF(this_03,(string *)local_150,bVar9);
  this->eif = this_03;
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  this_04 = (ENF *)operator_new(0x38);
  local_108._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ENF","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_108);
  util::variant::GetString_abi_cxx11_((string *)local_150,pmVar16);
  ENF::ENF(this_04,(string *)local_150,bVar9);
  this->enf = this_04;
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  this_05 = (ESF *)operator_new(0x38);
  local_108._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ESF","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_108);
  util::variant::GetString_abi_cxx11_((string *)local_150,pmVar16);
  ESF::ESF(this_05,(string *)local_150,bVar9);
  this->esf = this_05;
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  this_06 = (ECF *)operator_new(0x38);
  local_108._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"ECF","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_108);
  util::variant::GetString_abi_cxx11_((string *)local_150,pmVar16);
  ECF::ECF(this_06,(string *)local_150,bVar9);
  this->ecf = this_06;
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  pEVar25 = (this->enf->data).
            super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar3 = (this->enf->data).
           super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __new_size = ((long)pEVar3 - (long)pEVar25 >> 3) * -0x71c71c71c71c71c7;
  std::
  vector<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
  ::resize(local_c8,__new_size);
  if (pEVar3 != pEVar25) {
    lVar24 = 0;
    lVar23 = 0;
    do {
      puVar4 = (local_c8->
               super__Vector_base<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      this_07 = (NPC_Data *)operator_new(0xc0);
      NPC_Data::NPC_Data(this_07,this,(short)lVar23);
      std::__uniq_ptr_impl<NPC_Data,_std::default_delete<NPC_Data>_>::reset
                ((__uniq_ptr_impl<NPC_Data,_std::default_delete<NPC_Data>_> *)
                 ((long)&(puVar4->_M_t).
                         super___uniq_ptr_impl<NPC_Data,_std::default_delete<NPC_Data>_>._M_t +
                 lVar24),this_07);
      this_02._M_t.super__Tuple_impl<0UL,_NPC_Data_*,_std::default_delete<NPC_Data>_>.
      super__Head_base<0UL,_NPC_Data_*,_false>._M_head_impl =
           puVar4[lVar23]._M_t.super___uniq_ptr_impl<NPC_Data,_std::default_delete<NPC_Data>_>._M_t;
      if (*(short *)this_02._M_t.super__Tuple_impl<0UL,_NPC_Data_*,_std::default_delete<NPC_Data>_>.
                    super__Head_base<0UL,_NPC_Data_*,_false>._M_head_impl != 0) {
        NPC_Data::LoadShopDrop
                  ((NPC_Data *)
                   this_02._M_t.super__Tuple_impl<0UL,_NPC_Data_*,_std::default_delete<NPC_Data>_>.
                   super__Head_base<0UL,_NPC_Data_*,_false>._M_head_impl);
      }
      lVar23 = lVar23 + 1;
      lVar24 = lVar24 + 8;
    } while (__new_size + (__new_size == 0) != lVar23);
  }
  local_150 = (undefined1  [8])auStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Maps","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_150);
  iVar12 = util::variant::GetInt(pmVar16);
  std::vector<Map_*,_std::allocator<Map_*>_>::resize(local_c0,(long)iVar12);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  lVar23 = 0;
  uVar22 = 0;
  while( true ) {
    local_150 = (undefined1  [8])auStack_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Maps","");
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,(key_type *)local_150);
    iVar12 = util::variant::GetInt(pmVar16);
    if (local_150 != (undefined1  [8])auStack_140) {
      operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
    }
    if (iVar12 <= lVar23) break;
    this_08 = (Map *)operator_new(0xd8);
    Map::Map(this_08,(int)lVar23 + 1,this);
    (local_c0->super__Vector_base<Map_*,_std::allocator<Map_*>_>)._M_impl.super__Vector_impl_data.
    _M_start[lVar23] = this_08;
    uVar22 = uVar22 + (local_c0->super__Vector_base<Map_*,_std::allocator<Map_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar23]->exists;
    lVar23 = lVar23 + 1;
  }
  Console::Out("%i/%i maps loaded.",(ulong)uVar22,
               (ulong)((long)(this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3);
  local_150 = (undefined1  [8])auStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"Quests","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_150);
  iVar12 = util::variant::GetInt(pmVar16);
  sVar10 = (short)iVar12;
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  pEVar25 = (this->enf->data).
            super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar3 = (this->enf->data).
           super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar25 != pEVar3) {
    do {
      local_150._0_4_ = pEVar25->id;
      pcVar5 = (pEVar25->name)._M_dataplus._M_p;
      local_148 = (element_type *)(auStack_140 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_148,pcVar5,pcVar5 + (pEVar25->name)._M_string_length);
      local_128._0_4_ = pEVar25->graphic;
      local_128._4_2_ = pEVar25->boss;
      local_128._6_2_ = pEVar25->child;
      uStack_120._0_4_ = pEVar25->type;
      uVar7 = pEVar25->vendor_id;
      uVar8 = *(undefined2 *)&pEVar25->field_0x36;
      uStack_120._4_4_ = CONCAT22(uVar8,uVar7);
      local_118._0_4_ = pEVar25->hp;
      local_118._4_2_ = pEVar25->exp;
      local_118._6_2_ = pEVar25->mindam;
      uStack_110._0_2_ = pEVar25->maxdam;
      uStack_110._2_2_ = pEVar25->accuracy;
      uStack_110._4_2_ = pEVar25->evade;
      uStack_110._6_2_ = pEVar25->armor;
      iVar13 = uStack_120._4_4_;
      if ((short)uVar7 < (short)iVar12) {
        iVar13 = iVar12;
      }
      if ((undefined4)uStack_120 != 0xf) {
        iVar13 = iVar12;
      }
      iVar12 = iVar13;
      sVar10 = (short)iVar12;
      if (local_148 != (element_type *)(auStack_140 + 8)) {
        operator_delete(local_148,auStack_140._8_8_ + 1);
      }
      pEVar25 = pEVar25 + 1;
    } while (pEVar25 != pEVar3);
  }
  local_b8 = (long *)((ulong)local_b8 & 0xffffffffffff0000);
  if (-1 < sVar10) {
    do {
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_150 = (undefined1  [8])this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Quest,std::allocator<Quest>,short&,World*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length,
                 (Quest **)&local_108,(allocator<Quest> *)local_50,(short *)&local_b8,
                 (World **)local_150);
      local_150._0_2_ = (short)local_b8;
      local_148 = (element_type *)local_108._M_dataplus._M_p;
      auStack_140._0_8_ = local_108._M_string_length;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      std::
      _Rb_tree<short,std::pair<short_const,std::shared_ptr<Quest>>,std::_Select1st<std::pair<short_const,std::shared_ptr<Quest>>>,std::less<short>,std::allocator<std::pair<short_const,std::shared_ptr<Quest>>>>
      ::_M_emplace_unique<std::pair<short,std::shared_ptr<Quest>>>
                (local_58,(pair<short,_std::shared_ptr<Quest>_> *)local_150);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_140._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_140._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length);
      }
      sVar11 = (short)local_b8 + 1;
      local_b8 = (long *)CONCAT62(local_b8._2_6_,sVar11);
    } while (sVar11 <= sVar10);
  }
  Console::Out("%i/%i quests loaded.",
               (ulong)(uint)(this->quests)._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (ulong)(uint)(int)sVar10);
  this->last_character_id = 0;
  pTVar17 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(pTVar17,world_spawn_npcs,this,1.0,-1);
  Timer::Register(this_00,pTVar17);
  pTVar17 = (TimeEvent *)operator_new(0x30);
  TimeEvent::TimeEvent(pTVar17,world_act_npcs,this,0.05,-1);
  Timer::Register(this_00,pTVar17);
  local_150 = (undefined1  [8])auStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"RecoverSpeed","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_150);
  iVar12 = util::variant::GetInt(pmVar16);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if (0 < iVar12) {
    pTVar17 = (TimeEvent *)operator_new(0x30);
    local_150 = (undefined1  [8])auStack_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"RecoverSpeed","");
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,(key_type *)local_150);
    dVar6 = util::variant::GetFloat(pmVar16);
    TimeEvent::TimeEvent(pTVar17,world_recover,this,dVar6,-1);
    if (local_150 != (undefined1  [8])auStack_140) {
      operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
    }
    Timer::Register(this_00,pTVar17);
  }
  local_150 = (undefined1  [8])auStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"NPCRecoverSpeed","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_150);
  iVar12 = util::variant::GetInt(pmVar16);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if (0 < iVar12) {
    pTVar17 = (TimeEvent *)operator_new(0x30);
    local_150 = (undefined1  [8])auStack_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"NPCRecoverSpeed","");
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,(key_type *)local_150);
    dVar6 = util::variant::GetFloat(pmVar16);
    TimeEvent::TimeEvent(pTVar17,world_npc_recover,this,dVar6,-1);
    if (local_150 != (undefined1  [8])auStack_140) {
      operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
    }
    Timer::Register(this_00,pTVar17);
  }
  local_150 = (undefined1  [8])auStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"WarpSuck","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_150);
  iVar12 = util::variant::GetInt(pmVar16);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if (0 < iVar12) {
    pTVar17 = (TimeEvent *)operator_new(0x30);
    TimeEvent::TimeEvent(pTVar17,world_warp_suck,this,1.0,-1);
    Timer::Register(this_00,pTVar17);
  }
  local_150 = (undefined1  [8])auStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"ItemDespawn","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_150);
  bVar9 = util::variant::GetBool(pmVar16);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if (bVar9) {
    pTVar17 = (TimeEvent *)operator_new(0x30);
    local_150 = (undefined1  [8])auStack_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"ItemDespawnCheck","");
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,(key_type *)local_150);
    dVar6 = util::variant::GetFloat(pmVar16);
    TimeEvent::TimeEvent(pTVar17,world_despawn_items,this,dVar6,-1);
    if (local_150 != (undefined1  [8])auStack_140) {
      operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
    }
    Timer::Register(this_00,pTVar17);
  }
  local_150 = (undefined1  [8])auStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"TimedSave","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_150);
  bVar9 = util::variant::GetBool(pmVar16);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if (bVar9) {
    pTVar17 = (TimeEvent *)operator_new(0x30);
    local_150 = (undefined1  [8])auStack_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"TimedSave","");
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,(key_type *)local_150);
    dVar6 = util::variant::GetFloat(pmVar16);
    TimeEvent::TimeEvent(pTVar17,world_timed_save,this,dVar6,-1);
    if (local_150 != (undefined1  [8])auStack_140) {
      operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
    }
    Timer::Register(this_00,pTVar17);
  }
  local_150 = (undefined1  [8])auStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"SpikeTime","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_150);
  bVar9 = util::variant::GetBool(pmVar16);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if (bVar9) {
    pTVar17 = (TimeEvent *)operator_new(0x30);
    local_150 = (undefined1  [8])auStack_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"SpikeTime","");
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,(key_type *)local_150);
    dVar6 = util::variant::GetFloat(pmVar16);
    TimeEvent::TimeEvent(pTVar17,world_spikes,this,dVar6,-1);
    if (local_150 != (undefined1  [8])auStack_140) {
      operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
    }
    Timer::Register(this_00,pTVar17);
  }
  local_150 = (undefined1  [8])auStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"DrainTime","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_150);
  bVar9 = util::variant::GetBool(pmVar16);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if (bVar9) {
    pTVar17 = (TimeEvent *)operator_new(0x30);
    local_150 = (undefined1  [8])auStack_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"DrainTime","");
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,(key_type *)local_150);
    dVar6 = util::variant::GetFloat(pmVar16);
    TimeEvent::TimeEvent(pTVar17,world_drains,this,dVar6,-1);
    if (local_150 != (undefined1  [8])auStack_140) {
      operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
    }
    Timer::Register(this_00,pTVar17);
  }
  local_150 = (undefined1  [8])auStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"QuakeRate","");
  pmVar16 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,(key_type *)local_150);
  bVar9 = util::variant::GetBool(pmVar16);
  if (local_150 != (undefined1  [8])auStack_140) {
    operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
  }
  if (bVar9) {
    pTVar17 = (TimeEvent *)operator_new(0x30);
    local_150 = (undefined1  [8])auStack_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"QuakeRate","");
    pmVar16 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,(key_type *)local_150);
    dVar6 = util::variant::GetFloat(pmVar16);
    TimeEvent::TimeEvent(pTVar17,world_quakes,this,dVar6,-1);
    if (local_150 != (undefined1  [8])auStack_140) {
      operator_delete((void *)local_150,(ulong)(auStack_140._0_8_ + 1));
    }
    Timer::Register(this_00,pTVar17);
  }
  (this->exp_table)._M_elems[0] = 0;
  lVar23 = 0x15b;
  do {
    dVar6 = pow((double)(lVar23 + -0x15a),3.0);
    dVar6 = util::round(dVar6 * 133.1);
    (&this->last_character_id)[lVar23] = (int)dVar6;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 600);
  lVar23 = 0;
  do {
    pBVar18 = (Board *)operator_new(0x20);
    pBVar18->id = (int)lVar23;
    pBVar18->last_id = 0;
    *(list<Board_Post_*,_std::allocator<Board_Post_*>_> **)
     ((long)&(pBVar18->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl.
             _M_node.super__List_node_base + 8) = &pBVar18->posts;
    (pBVar18->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)&pBVar18->posts;
    (pBVar18->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl._M_node.
    _M_size = 0;
    (this->boards)._M_elems[lVar23] = pBVar18;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 8);
  pGVar19 = (GuildManager *)operator_new(0x80);
  pGVar19->cache_clearing = false;
  (pGVar19->cache)._M_h._M_buckets = &(pGVar19->cache)._M_h._M_single_bucket;
  (pGVar19->cache)._M_h._M_bucket_count = 1;
  (pGVar19->cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pGVar19->cache)._M_h._M_element_count = 0;
  (pGVar19->cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pGVar19->cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (pGVar19->cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (pGVar19->create_cache)._M_h._M_buckets = &(pGVar19->create_cache)._M_h._M_single_bucket;
  (pGVar19->create_cache)._M_h._M_bucket_count = 1;
  (pGVar19->create_cache)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (pGVar19->create_cache)._M_h._M_element_count = 0;
  (pGVar19->create_cache)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (pGVar19->create_cache)._M_h._M_rehash_policy._M_next_resize = 0;
  (pGVar19->create_cache)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pGVar19->world = this;
  this->guildmanager = pGVar19;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,
                    CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                             local_e8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

World::World(std::array<std::string, 6> dbinfo, const Config &eoserv_config, const Config &admin_config)
	: i18n(eoserv_config.find("ServerLanguage")->second)
	, admin_count(0)
{
	if (int(this->timer.resolution * 1000.0) > 1)
	{
		Console::Out("Timers set at approx. %i ms resolution", int(this->timer.resolution * 1000.0));
	}
	else
	{
		Console::Out("Timers set at < 1 ms resolution");
	}

	this->config = eoserv_config;
	this->admin_config = admin_config;

	Database::Engine engine;

	std::string dbdesc;

	if (util::lowercase(dbinfo[0]).compare("sqlite") == 0)
	{
		engine = Database::SQLite;
		dbdesc = std::string("SQLite: ")
		       + dbinfo[1];
	}
	else
	{
		engine = Database::MySQL;
		dbdesc = std::string("MySQL: ")
		       + dbinfo[2] + "@"
		       + dbinfo[1];

		if (dbinfo[5] != "0" && dbinfo[5] != "3306")
			dbdesc += ":" + dbinfo[5];

		dbdesc += "/" + dbinfo[4];
	}

	Console::Out("Connecting to database (%s)...", dbdesc.c_str());
	this->db.Connect(engine, dbinfo[1], util::to_int(dbinfo[5]), dbinfo[2], dbinfo[3], dbinfo[4]);
	this->BeginDB();

	this->drops_config.Read(this->config["DropsFile"]);
	this->shops_config.Read(this->config["ShopsFile"]);
	this->arenas_config.Read(this->config["ArenasFile"]);
	this->formulas_config.Read(this->config["FormulasFile"]);
	this->home_config.Read(this->config["HomeFile"]);
	this->skills_config.Read(this->config["SkillsFile"]);

	this->UpdateConfig();
	this->LoadHome();

	bool auto_split = this->config["AutoSplitPubFiles"];

	this->eif = new EIF(this->config["EIF"], auto_split);
	this->enf = new ENF(this->config["ENF"], auto_split);
	this->esf = new ESF(this->config["ESF"], auto_split);
	this->ecf = new ECF(this->config["ECF"], auto_split);

	std::size_t num_npcs = this->enf->data.size();
	this->npc_data.resize(num_npcs);
	for (std::size_t i = 0; i < num_npcs; ++i)
	{
		auto& npc = this->npc_data[i];
		npc.reset(new NPC_Data(this, i));
		if (npc->id != 0)
			npc->LoadShopDrop();
	}

	this->maps.resize(static_cast<int>(this->config["Maps"]));
	int loaded = 0;
	for (int i = 0; i < static_cast<int>(this->config["Maps"]); ++i)
	{
		this->maps[i] = new Map(i + 1, this);
		if (this->maps[i]->exists)
			++loaded;
	}
	Console::Out("%i/%i maps loaded.", loaded, static_cast<int>(this->maps.size()));

	short max_quest = static_cast<int>(this->config["Quests"]);

	UTIL_FOREACH(this->enf->data, npc)
	{
		if (npc.type == ENF::Quest)
			max_quest = std::max(max_quest, npc.vendor_id);
	}

	for (short i = 0; i <= max_quest; ++i)
	{
		try
		{
			std::shared_ptr<Quest> q = std::make_shared<Quest>(i, this);
			this->quests.insert(std::make_pair(i, std::move(q)));
		}
		catch (...)
		{

		}
	}
	Console::Out("%i/%i quests loaded.", static_cast<int>(this->quests.size()), max_quest);

	this->last_character_id = 0;

	TimeEvent *event = new TimeEvent(world_spawn_npcs, this, 1.0, Timer::FOREVER);
	this->timer.Register(event);

	event = new TimeEvent(world_act_npcs, this, 0.05, Timer::FOREVER);
	this->timer.Register(event);

	if (int(this->config["RecoverSpeed"]) > 0)
	{
		event = new TimeEvent(world_recover, this, double(this->config["RecoverSpeed"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (int(this->config["NPCRecoverSpeed"]) > 0)
	{
		event = new TimeEvent(world_npc_recover, this, double(this->config["NPCRecoverSpeed"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (int(this->config["WarpSuck"]) > 0)
	{
		event = new TimeEvent(world_warp_suck, this, 1.0, Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["ItemDespawn"])
	{
		event = new TimeEvent(world_despawn_items, this, static_cast<double>(this->config["ItemDespawnCheck"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["TimedSave"])
	{
		event = new TimeEvent(world_timed_save, this, static_cast<double>(this->config["TimedSave"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["SpikeTime"])
	{
		event = new TimeEvent(world_spikes, this, static_cast<double>(this->config["SpikeTime"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["DrainTime"])
	{
		event = new TimeEvent(world_drains, this, static_cast<double>(this->config["DrainTime"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	if (this->config["QuakeRate"])
	{
		event = new TimeEvent(world_quakes, this, static_cast<double>(this->config["QuakeRate"]), Timer::FOREVER);
		this->timer.Register(event);
	}

	exp_table[0] = 0;
	for (std::size_t i = 1; i < this->exp_table.size(); ++i)
	{
		exp_table[i] = int(util::round(std::pow(double(i), 3.0) * 133.1));
	}

	for (std::size_t i = 0; i < this->boards.size(); ++i)
	{
		this->boards[i] = new Board(i);
	}

	this->guildmanager = new GuildManager(this);
}